

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vs_wrapper.hpp
# Opt level: O2

void __thiscall
VSInterface::VSInDelegator::Read
          (VSInDelegator *this,char *name,vector<long,_std::allocator<long>_> *output)

{
  int iVar1;
  int64_t in_RAX;
  int i;
  int iVar2;
  int64_t local_38;
  
  local_38 = in_RAX;
  iVar1 = (*this->_vsapi->propNumElements)(this->_in,name);
  if (-1 < iVar1) {
    if (*(long *)(output + 8) != *(long *)output) {
      *(long *)(output + 8) = *(long *)output;
    }
    for (iVar2 = 0; iVar1 != iVar2; iVar2 = iVar2 + 1) {
      local_38 = (*this->_vsapi->propGetInt)(this->_in,name,iVar2,&this->_err);
      std::vector<long,_std::allocator<long>_>::emplace_back<long>(output,&local_38);
    }
  }
  return;
}

Assistant:

void Read(const char* name, std::vector<int64_t>& output) override {
      auto size = _vsapi->propNumElements(_in, name);
      if (size < 0) return;
      output.clear();
      for (int i = 0; i < size; i++)
        output.push_back(_vsapi->propGetInt(_in, name, i, &_err));
    }